

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

void __thiscall wabt::interp::Exception::Mark(Exception *this,Store *store)

{
  uint uVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  ValueTypes params;
  Ptr tag;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_58;
  RefPtr<wabt::interp::Tag> local_40;
  
  RefPtr<wabt::interp::Tag>::RefPtr(&local_40,store,(Ref)(this->tag_).index);
  Store::Mark(store,(Ref)(this->tag_).index);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&local_58,
             &((local_40.obj_)->type_).signature);
  lVar3 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)local_58._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_58._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar2 = uVar2 + 1) {
    uVar1 = local_58._M_impl.super__Vector_impl_data._M_start[uVar2].enum_ + 0x17;
    if ((uVar1 < 8) && ((0xc5U >> (uVar1 & 0x1f) & 1) != 0)) {
      Store::Mark(store,(Ref)*(size_t *)
                              ((long)&((this->args_).
                                       super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar3))
      ;
    }
    lVar3 = lVar3 + 0x10;
  }
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_58);
  RefPtr<wabt::interp::Tag>::reset(&local_40);
  return;
}

Assistant:

void Exception::Mark(Store& store) {
  Tag::Ptr tag(store, tag_);
  store.Mark(tag_);
  ValueTypes params = tag->type().signature;
  for (size_t i = 0; i < params.size(); i++) {
    if (params[i].IsRef()) {
      store.Mark(args_[i].Get<Ref>());
    }
  }
}